

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O2

void __thiscall kj::_::Debug::Fault::fatal(Fault *this)

{
  Exception *this_00;
  Exception copy;
  
  Exception::Exception(&copy,this->exception);
  this_00 = this->exception;
  if (this_00 != (Exception *)0x0) {
    Exception::~Exception(this_00);
  }
  operator_delete(this_00,0x158);
  this->exception = (Exception *)0x0;
  throwFatalException(&copy,2);
}

Assistant:

void Debug::Fault::fatal() {
  Exception copy = mv(*exception);
  delete exception;
  exception = nullptr;
  throwFatalException(mv(copy), 2);
  abort();
}